

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_ucs_to_Utf16(uint ucs,unsigned_short *dst,uint dstlen)

{
  uint uVar1;
  unsigned_short **local_30;
  unsigned_short *out;
  unsigned_short u16 [4];
  uint count;
  uint dstlen_local;
  unsigned_short *dst_local;
  uint ucs_local;
  
  if ((dstlen == 0) || (local_30 = (unsigned_short **)dst, dst == (unsigned_short *)0x0)) {
    local_30 = &out;
  }
  u16._4_4_ = dstlen;
  if ((ucs < 0x110000) && ((ucs < 0xd800 || (0xdfff < ucs)))) {
    if (ucs < 0x10000) {
      *(ushort *)local_30 = (ushort)ucs;
      u16[0] = 1;
      u16[1] = 0;
    }
    else {
      if (dstlen < 2) {
        *(ushort *)local_30 = 0xfffd;
      }
      else {
        *(ushort *)local_30 = ((ushort)(ucs - 0x10000 >> 10) & 0x3ff) + 0xd800;
        *(ushort *)((long)local_30 + 2) = ((ushort)ucs & 0x3ff) + 0xdc00;
      }
      u16[0] = 2;
      u16[1] = 0;
    }
  }
  else {
    *(ushort *)local_30 = 0xfffd;
    u16[0] = 1;
    u16[1] = 0;
  }
  if ((uint)u16._0_4_ < (uint)u16._4_4_) {
    *(ushort *)((long)local_30 + (ulong)(uint)u16._0_4_ * 2) = 0;
  }
  uVar1._0_2_ = u16[0];
  uVar1._2_2_ = u16[1];
  return uVar1;
}

Assistant:

unsigned fl_ucs_to_Utf16(const unsigned ucs, unsigned short *dst, const unsigned dstlen)
{
  /* The rule for direct conversion from UCS to UTF16 is:
   * - if UCS >  0x0010FFFF then UCS is invalid
   * - if UCS >= 0xD800 && UCS <= 0xDFFF UCS is invalid
   * - if UCS <= 0x0000FFFF then U16 = UCS, len = 1
   * - else
   * -- U16[0] = ((UCS - 0x00010000) >> 10) & 0x3FF + 0xD800
   * -- U16[1] = (UCS & 0x3FF) + 0xDC00
   * -- len = 2;
   */
  unsigned count;        /* Count of converted UTF16 cells */
  unsigned short u16[4]; /* Alternate buffer if dst is not set */
  unsigned short *out;   /* points to the active buffer */
  /* Ensure we have a valid buffer to write to */
  if((!dstlen) || (!dst)) {
    out = u16;
  } else {
    out = dst;
  }
  /* Convert from UCS to UTF16 */
  if((ucs > 0x0010FFFF) || /* UCS is too large */
  ((ucs > 0xD7FF) && (ucs < 0xE000))) { /* UCS in invalid range */
    out[0] = 0xFFFD; /* REPLACEMENT CHARACTER */
    count = 1;
  } else if(ucs < 0x00010000) {
    out[0] = (unsigned short)ucs;
    count = 1;
  } else if(dstlen < 2) { /* dst is too small for the result */
    out[0] = 0xFFFD; /* REPLACEMENT CHARACTER */
    count = 2;
  } else {
    out[0] = (((ucs - 0x00010000) >> 10) & 0x3FF) + 0xD800;
    out[1] = (ucs & 0x3FF) + 0xDC00;
    count = 2;
  }
  /* NULL terminate the output, if there is space */
  if(count < dstlen) { out[count] = 0; }
  return count;
}